

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::SkipWhitespaceAndNewline(AsciiParser *this,bool allow_semicolon)

{
  int *piVar1;
  StreamReader *pSVar2;
  bool bVar3;
  undefined8 in_RAX;
  ulong uVar4;
  char d;
  char c;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  do {
    while( true ) {
      bVar3 = Eof(this);
      if (bVar3) {
        return true;
      }
      bVar3 = Char1(this,(char *)((long)&uStack_38 + 7));
      if (!bVar3) {
        return false;
      }
      if (((0x20 < (ulong)uStack_38._7_1_) ||
          ((0x100001200U >> ((ulong)uStack_38._7_1_ & 0x3f) & 1) == 0)) &&
         (uStack_38._7_1_ != 0x3b || !allow_semicolon)) break;
      piVar1 = &(this->_curr_cursor).col;
      *piVar1 = *piVar1 + 1;
    }
    if (uStack_38._7_1_ == 0xd) {
      if (this->_sr->idx_ < this->_sr->length_ - 1) {
        bVar3 = Char1(this,(char *)((long)&uStack_38 + 6));
        if (!bVar3) {
          return false;
        }
        if (uStack_38._6_1_ != '\n') {
          pSVar2 = this->_sr;
          if ((long)pSVar2->idx_ < 1) {
            return false;
          }
          uVar4 = pSVar2->idx_ - 1;
          if (pSVar2->length_ < uVar4) {
            return false;
          }
          pSVar2->idx_ = uVar4;
        }
      }
    }
    else if (uStack_38._7_1_ != 10) {
      pSVar2 = this->_sr;
      if ((long)pSVar2->idx_ < 1) {
        return false;
      }
      uVar4 = pSVar2->idx_ - 1;
      if (pSVar2->length_ < uVar4) {
        return false;
      }
      pSVar2->idx_ = uVar4;
      return true;
    }
    (this->_curr_cursor).col = 0;
    (this->_curr_cursor).row = (this->_curr_cursor).row + 1;
  } while( true );
}

Assistant:

bool AsciiParser::SkipWhitespaceAndNewline(const bool allow_semicolon) {
  // USDA also allow C-style ';' as a newline separator.
  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }

    // printf("sws c = %c\n", c);

    if ((c == ' ') || (c == '\t') || (c == '\f')) {
      _curr_cursor.col++;
      // continue
    } else if (allow_semicolon && (c == ';')) {
      _curr_cursor.col++;
      // continue
    } else if (c == '\n') {
      _curr_cursor.col = 0;
      _curr_cursor.row++;
      // continue
    } else if (c == '\r') {
      // CRLF?
      if (_sr->tell() < (_sr->size() - 1)) {
        char d;
        if (!Char1(&d)) {
          // this should not happen.
          return false;
        }

        if (d == '\n') {
          // CRLF
        } else {
          // unwind 1 char
          if (!_sr->seek_from_current(-1)) {
            // this should not happen.
            return false;
          }
        }
      }
      _curr_cursor.col = 0;
      _curr_cursor.row++;
      // continue
    } else {
      // end loop
      if (!_sr->seek_from_current(-1)) {
        return false;
      }
      break;
    }
  }

  return true;
}